

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O1

ProcessorAndChannel * __thiscall
soul::heart::Parser::readProcessorAndChannel
          (ProcessorAndChannel *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  int32_t iVar2;
  string name;
  string local_68;
  undefined1 local_48 [32];
  
  (__return_storage_ptr__->processor).object = (ProcessorInstance *)0x0;
  (__return_storage_ptr__->endpoint)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->endpoint).field_2;
  (__return_storage_ptr__->endpoint)._M_string_length = 0;
  (__return_storage_ptr__->endpoint).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->endpointIndex).super__Optional_base<unsigned_long,_true,_true>._M_payload
  .super__Optional_payload_base<unsigned_long>._M_engaged = false;
  readQualifiedGeneralIdentifier_abi_cxx11_(&local_68,this);
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x288ec7);
  if (bVar1) {
    findProcessorInstance((Parser *)local_48,(string *)this);
    (__return_storage_ptr__->processor).object = (ProcessorInstance *)local_48._0_8_;
    readGeneralIdentifier_abi_cxx11_((string *)local_48,this);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->endpoint,(string *)local_48);
    if ((ProcessorInstance *)local_48._0_8_ != (ProcessorInstance *)(local_48 + 0x10)) {
      operator_delete((void *)local_48._0_8_,(ulong)(local_48._16_8_ + 1));
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->endpoint);
  }
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x288e63);
  if (bVar1) {
    iVar2 = parseInt32(this);
    (__return_storage_ptr__->endpointIndex).super__Optional_base<unsigned_long,_true,_true>.
    _M_payload.super__Optional_payload_base<unsigned_long>._M_payload =
         (_Storage<unsigned_long,_true>)(long)iVar2;
    if ((__return_storage_ptr__->endpointIndex).super__Optional_base<unsigned_long,_true,_true>.
        _M_payload.super__Optional_payload_base<unsigned_long>._M_engaged == false) {
      (__return_storage_ptr__->endpointIndex).super__Optional_base<unsigned_long,_true,_true>.
      _M_payload.super__Optional_payload_base<unsigned_long>._M_engaged = true;
    }
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x2883b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

ProcessorAndChannel readProcessorAndChannel()
    {
        ProcessorAndChannel processorAndChannel;

        auto name = readQualifiedGeneralIdentifier();

        if (matchIf (HEARTOperator::dot))
        {
            processorAndChannel.processor = findProcessorInstance (name);
            processorAndChannel.endpoint   = readGeneralIdentifier();
        }
        else
        {
            processorAndChannel.endpoint = name;
        }

        if (matchIf (HEARTOperator::openBracket))
        {
            processorAndChannel.endpointIndex = parseInt32();

            expect (HEARTOperator::closeBracket);
        }

        return processorAndChannel;
    }